

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O1

int __thiscall
GEO::geofile::import_mesh_spacing
          (geofile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *split_string_vector)

{
  int iVar1;
  pointer pbVar2;
  pointer pcVar3;
  long *__nptr;
  bool bVar4;
  size_type sVar5;
  int *piVar6;
  undefined8 uVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  double dVar11;
  string msh_spc;
  long *local_58;
  char *pcStack_50;
  long local_48 [2];
  long *local_38;
  
  pbVar2 = (split_string_vector->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_58 = (long *)0x17504d;
  pcStack_50 = "";
  pcVar9 = pbVar2[1]._M_dataplus._M_p;
  sVar5 = pbVar2[1]._M_string_length;
  pcVar8 = pcVar9 + sVar5;
  for (; pcVar10 = pcVar8, sVar5 != 0; sVar5 = sVar5 - 1) {
    if (*pcVar9 == ';') {
      pcVar8 = pcVar9 + 1;
      pcVar10 = pcVar9;
      break;
    }
    pcVar9 = pcVar9 + 1;
  }
  if (pcVar10 != pcVar8) {
    boost::algorithm::detail::
    find_format_all_impl2<std::__cxx11::string,boost::algorithm::detail::first_finderF<char_const*,boost::algorithm::is_equal>,boost::algorithm::detail::empty_formatF<char>,boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::algorithm::detail::empty_container<char>>
              (pbVar2 + 1);
  }
  pbVar2 = (split_string_vector->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar4 = is_e_notation(pbVar2 + 1);
  if (!bVar4) {
    return 1;
  }
  pcVar3 = pbVar2[1]._M_dataplus._M_p;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,pcVar3 + pbVar2[1]._M_string_length);
  __nptr = local_58;
  piVar6 = __errno_location();
  iVar1 = *piVar6;
  *piVar6 = 0;
  dVar11 = strtod((char *)__nptr,(char **)&local_38);
  if (local_38 == __nptr) {
    uVar7 = std::__throw_invalid_argument("stod");
    if (*piVar6 == 0) {
      *piVar6 = iVar1;
    }
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
    _Unwind_Resume(uVar7);
  }
  if (*piVar6 != 0) {
    if (*piVar6 != 0x22) goto LAB_0012cfcd;
    dVar11 = (double)std::__throw_out_of_range("stod");
  }
  *piVar6 = iVar1;
LAB_0012cfcd:
  this->mesh_spacing = dVar11;
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return 0;
}

Assistant:

int GEO::geofile::import_mesh_spacing(std::vector<std::string> &split_string_vector)
{
    boost::erase_all(split_string_vector[1], ";");
    if (is_e_notation(split_string_vector[1]))
    {
        std::string msh_spc = split_string_vector[1];
        mesh_spacing = std::stod(msh_spc);
        return EXIT_SUCCESS;
    }
    else
        return EXIT_FAILURE;
}